

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gcoflow.c
# Opt level: O1

DLword gcmaptable(DLword arg)

{
  int *piVar1;
  uint uVar2;
  uint *puVar3;
  DLword *pDVar4;
  uint uVar5;
  uint uVar6;
  long lVar7;
  long lVar8;
  
  uVar6 = *MaxTypeNumber_word;
  if ((uVar6 & 0xfff0000) == 0xf0000) {
    uVar6 = uVar6 | 0xffff0000;
  }
  else if ((uVar6 & 0xfff0000) == 0xe0000) {
    uVar6 = uVar6 & 0xffff;
  }
  else {
    error("Not smallp address");
    uVar6 = 0;
  }
  uVar2 = *HToverflow;
  puVar3 = HToverflow;
  while (uVar5 = uVar2 & 0xfffffff, uVar5 != 0) {
    if ((-1 < *(short *)((ulong)(uVar5 >> 8 & 0xfffffffe) + (long)MDStypetbl ^ 2)) &&
       (*GcDisabled_word != 0x4c)) {
      rec_htfind(uVar5,uVar2 >> 0x1c);
    }
    *puVar3 = 0;
    uVar2 = puVar3[1];
    puVar3 = puVar3 + 1;
  }
  if (0 < (int)uVar6) {
    lVar8 = 0x2a;
    lVar7 = 0x20;
    do {
      pDVar4 = DTDspace;
      if (*(ushort *)((long)DTDspace + lVar8) != 0) {
        piVar1 = (int *)((long)DTDspace + lVar8 + 0x12);
        uVar5 = (uint)*(ushort *)((long)DTDspace + lVar8);
        *piVar1 = *piVar1 + uVar5;
        *(undefined2 *)((long)pDVar4 + lVar8) = 0;
        uVar2 = *Reclaim_cnt_word;
        if (uVar2 != 0) {
          if (uVar2 < uVar5 || uVar2 - uVar5 == 0) {
            *Reclaim_cnt_word = 0;
            doreclaim();
          }
          else {
            *Reclaim_cnt_word = uVar2 - uVar5;
          }
        }
      }
      lVar8 = lVar8 + 0x24;
      lVar7 = lVar7 + 0x20;
    } while ((ulong)uVar6 * 0x20 + 0x20 != lVar7);
  }
  return arg;
}

Assistant:

DLword gcmaptable(DLword arg) {
  struct htoverflow *cell;
  struct dtd *ptr;
  LispPTR cellcnt;
  int typnum;
  LispPTR addr;
  int maxtypenumber = GetSmalldata(*MaxTypeNumber_word);

  cell = (struct htoverflow *)HToverflow;
  /* This proc. protected from interrupt */
  while ((addr = cell->ptr) != NIL) {
    REC_GCLOOKUP(addr, cell->pcase);
    cell->ptr = 0;
    cell->pcase = 0;
    ++cell; /* (\ADDBASE CELL WORDSPERCELL) */
  }
  for (typnum = 1; typnum <= maxtypenumber; ++typnum)
  /* applied alltype */
  {
    ptr = (struct dtd *)GetDTD(typnum);
    if ((cellcnt = ptr->dtd_cnt0) != 0) {
      ptr->dtd_oldcnt += cellcnt;
      ptr->dtd_cnt0 = 0;
      Increment_Allocation_Count(cellcnt);
    }
  }
  return (arg);
}